

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

sexp_conflict
json_write_string(sexp_conflict ctx,sexp_conflict self,sexp_conflict obj,sexp_conflict out)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int __c;
  sexp_conflict psVar5;
  ulong uVar6;
  ulong uVar7;
  sexp_conflict ctx_00;
  long in_RCX;
  long in_RDX;
  undefined8 in_RDI;
  sexp_conflict end;
  sexp_conflict i;
  unsigned_long chl;
  unsigned_long chh;
  unsigned_long ch;
  char cout [32];
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  sexp_conflict self_00;
  char local_48 [32];
  long local_28;
  long local_20;
  undefined8 local_10;
  sexp_conflict local_8;
  
  psVar5 = (sexp_conflict)(*(long *)(in_RDX + 0x18) << 3 | 2);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  if (*(long *)(in_RCX + 0x28) == 0) {
    putc(0x22,*(FILE **)(in_RCX + 0x20));
  }
  else if (*(ulong *)(in_RCX + 0x38) < *(ulong *)(in_RCX + 0x50)) {
    lVar1 = *(long *)(in_RCX + 0x38);
    *(long *)(in_RCX + 0x38) = lVar1 + 1;
    *(undefined1 *)(*(long *)(in_RCX + 0x28) + lVar1) = 0x22;
    in_stack_ffffffffffffff8c = 0;
  }
  else {
    in_stack_ffffffffffffff8c = sexp_buffered_write_char(in_RDI,0x22,in_RCX);
  }
  self_00 = (sexp_conflict)0x2;
  do {
    if (psVar5 <= self_00) {
      if (*(long *)(local_28 + 0x28) == 0) {
        putc(0x22,*(FILE **)(local_28 + 0x20));
      }
      else if (*(ulong *)(local_28 + 0x38) < *(ulong *)(local_28 + 0x50)) {
        lVar1 = *(long *)(local_28 + 0x38);
        *(long *)(local_28 + 0x38) = lVar1 + 1;
        *(undefined1 *)(*(long *)(local_28 + 0x28) + lVar1) = 0x22;
      }
      else {
        sexp_buffered_write_char(local_10,0x22,local_28);
      }
      local_8 = (sexp_conflict)&DAT_0000043e;
      return local_8;
    }
    sexp_string_utf8_ref(local_10,local_20,self_00);
    uVar6 = (ulong)__c;
    if (uVar6 < 0x7f) {
      if (uVar6 == 8) {
        if (*(long *)(local_28 + 0x28) == 0) {
          fputs("\\b",*(FILE **)(local_28 + 0x20));
        }
        else {
          sexp_buffered_write_string(local_10,"\\b",local_28);
        }
      }
      else if (uVar6 == 9) {
        if (*(long *)(local_28 + 0x28) == 0) {
          fputs("\\t",*(FILE **)(local_28 + 0x20));
        }
        else {
          sexp_buffered_write_string(local_10,"\\t",local_28);
        }
      }
      else if (uVar6 == 10) {
        if (*(long *)(local_28 + 0x28) == 0) {
          fputs("\\n",*(FILE **)(local_28 + 0x20));
        }
        else {
          sexp_buffered_write_string(local_10,"\\n",local_28);
        }
      }
      else if (uVar6 == 0xc) {
        if (*(long *)(local_28 + 0x28) == 0) {
          fputs("\\f",*(FILE **)(local_28 + 0x20));
        }
        else {
          sexp_buffered_write_string(local_10,"\\f",local_28);
        }
      }
      else if (uVar6 == 0xd) {
        if (*(long *)(local_28 + 0x28) == 0) {
          fputs("\\r",*(FILE **)(local_28 + 0x20));
        }
        else {
          sexp_buffered_write_string(local_10,"\\r",local_28);
        }
      }
      else if (uVar6 == 0x5c) {
        if (*(long *)(local_28 + 0x28) == 0) {
          fputs("\\\\",*(FILE **)(local_28 + 0x20));
        }
        else {
          sexp_buffered_write_string(local_10,"\\\\",local_28);
        }
      }
      else if (*(long *)(local_28 + 0x28) == 0) {
        putc(__c,*(FILE **)(local_28 + 0x20));
      }
      else if (*(ulong *)(local_28 + 0x38) < *(ulong *)(local_28 + 0x50)) {
        lVar1 = *(long *)(local_28 + 0x38);
        *(long *)(local_28 + 0x38) = lVar1 + 1;
        *(char *)(*(long *)(local_28 + 0x28) + lVar1) = (char)__c;
      }
      else {
        sexp_buffered_write_char(local_10,__c,local_28);
      }
    }
    else if (uVar6 < 0x10000) {
      snprintf(local_48,0x20,"\\u%04lX",uVar6);
      if (*(long *)(local_28 + 0x28) == 0) {
        fputs(local_48,*(FILE **)(local_28 + 0x20));
      }
      else {
        sexp_buffered_write_string(local_10,local_48,local_28);
      }
    }
    else {
      uVar7 = (uVar6 >> 10) + 0xd7c0;
      ctx_00 = (sexp_conflict)((uVar6 & 0x3ff) + 0xdc00);
      if ((0xffff < uVar7) || ((sexp_conflict)0xffff < ctx_00)) {
        psVar5 = sexp_json_write_exception
                           (ctx_00,self_00,(char *)psVar5,
                            (sexp_conflict)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        return psVar5;
      }
      snprintf(local_48,0x20,"\\u%04lX\\u%04lX",uVar7,ctx_00);
      if (*(long *)(local_28 + 0x28) == 0) {
        fputs(local_48,*(FILE **)(local_28 + 0x20));
      }
      else {
        sexp_buffered_write_string(local_10,local_48,local_28);
      }
    }
    auVar2._8_8_ = (long)self_00 >> 0x3f;
    auVar2._0_8_ = (ulong)self_00 & 0xfffffffffffffffd;
    auVar3._8_8_ = (long)self_00 >> 0x3f;
    auVar3._0_8_ = (ulong)self_00 & 0xfffffffffffffffd;
    iVar4 = sexp_utf8_initial_byte_count
                      (*(undefined1 *)
                        (*(long *)(local_20 + 8) + 0x10 + *(long *)(local_20 + 0x10) +
                        SUB168(auVar3 / SEXT816(8),0)));
    self_00 = (sexp_conflict)((SUB168(auVar2 / SEXT816(8),0) + (long)iVar4) * 8 | 2);
  } while( true );
}

Assistant:

sexp json_write_string(sexp ctx, sexp self, const sexp obj, sexp out) {
  char cout[32];  /* oversized to avoid snprintf warnings */
  unsigned long ch, chh, chl;
  sexp i, end = sexp_make_string_cursor(sexp_string_size(obj));

  sexp_write_char(ctx, '"', out);
  for (i = sexp_make_string_cursor(0); i < end;
       i = sexp_string_cursor_next(obj, i)) {
    ch = sexp_unbox_character(sexp_string_cursor_ref(ctx, obj, i));
    if (ch < 0x7F) {
      switch (ch) {
        case '\\':
          sexp_write_string(ctx, "\\\\", out);
          break;
        case '\b':
          sexp_write_string(ctx, "\\b", out);
          break;
        case '\f':
          sexp_write_string(ctx, "\\f", out);
          break;
        case '\n':
          sexp_write_string(ctx, "\\n", out);
          break;
        case '\r':
          sexp_write_string(ctx, "\\r", out);
          break;
        case '\t':
          sexp_write_string(ctx, "\\t", out);
          break;
        default:
          sexp_write_char(ctx, ch, out);
          break;
      }
    } else if (ch <= 0xFFFF) {
      snprintf(cout, sizeof(cout), "\\u%04lX", ch);
      sexp_write_string(ctx, cout, out);
    } else {
      // Surrogate pair
      chh = (0xD800 - (0x10000 >> 10) + ((ch) >> 10));
      chl = (0xDC00 + ((ch) & 0x3FF));
      if (chh > 0xFFFF || chl > 0xFFFF) {
        return sexp_json_write_exception(ctx, self, "unable to encode string", obj);
      }
      snprintf(cout, sizeof(cout), "\\u%04lX\\u%04lX", chh, chl);
      sexp_write_string(ctx, cout, out);
    }
  }
  sexp_write_char(ctx, '"', out);

  return SEXP_VOID;
}